

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

void __thiscall
cmConditionEvaluator::cmConditionEvaluator
          (cmConditionEvaluator *this,cmMakefile *makefile,cmListFileContext *context,
          cmListFileBacktrace *bt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 uVar5;
  PolicyStatus PVar6;
  
  this->Makefile = makefile;
  paVar1 = &(this->ExecutionContext).Name.field_2;
  (this->ExecutionContext).Name._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (context->Name)._M_dataplus._M_p;
  paVar2 = &(context->Name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar5 = *(undefined8 *)((long)&(context->Name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->ExecutionContext).Name.field_2 + 8) = uVar5;
  }
  else {
    (this->ExecutionContext).Name._M_dataplus._M_p = pcVar3;
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->ExecutionContext).Name._M_string_length = (context->Name)._M_string_length;
  (context->Name)._M_dataplus._M_p = (pointer)paVar2;
  (context->Name)._M_string_length = 0;
  (context->Name).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->ExecutionContext).FilePath.field_2;
  (this->ExecutionContext).FilePath._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (context->FilePath)._M_dataplus._M_p;
  paVar2 = &(context->FilePath).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar5 = *(undefined8 *)((long)&(context->FilePath).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->ExecutionContext).FilePath.field_2 + 8) = uVar5;
  }
  else {
    (this->ExecutionContext).FilePath._M_dataplus._M_p = pcVar3;
    (this->ExecutionContext).FilePath.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->ExecutionContext).FilePath._M_string_length = (context->FilePath)._M_string_length;
  (context->FilePath)._M_dataplus._M_p = (pointer)paVar2;
  (context->FilePath)._M_string_length = 0;
  (context->FilePath).field_2._M_local_buf[0] = '\0';
  (this->ExecutionContext).Line = context->Line;
  (this->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (bt->TopEntry).
       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (bt->TopEntry).
           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (bt->TopEntry).super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var4;
  (bt->TopEntry).super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  PVar6 = cmMakefile::GetPolicyStatus(makefile,CMP0012,false);
  this->Policy12Status = PVar6;
  PVar6 = cmMakefile::GetPolicyStatus(makefile,CMP0054,false);
  this->Policy54Status = PVar6;
  PVar6 = cmMakefile::GetPolicyStatus(makefile,CMP0057,false);
  this->Policy57Status = PVar6;
  PVar6 = cmMakefile::GetPolicyStatus(makefile,CMP0064,false);
  this->Policy64Status = PVar6;
  return;
}

Assistant:

cmConditionEvaluator::cmConditionEvaluator(cmMakefile& makefile,
                                           cmListFileContext context,
                                           cmListFileBacktrace bt)
  : Makefile(makefile)
  , ExecutionContext(std::move(context))
  , Backtrace(std::move(bt))
  , Policy12Status(makefile.GetPolicyStatus(cmPolicies::CMP0012))
  , Policy54Status(makefile.GetPolicyStatus(cmPolicies::CMP0054))
  , Policy57Status(makefile.GetPolicyStatus(cmPolicies::CMP0057))
  , Policy64Status(makefile.GetPolicyStatus(cmPolicies::CMP0064))
{
}